

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall AST::toDot(AST *this,string *filename)

{
  ASTree *this_00;
  string local_30;
  
  this_00 = this->ast;
  std::__cxx11::string::string((string *)&local_30,(string *)filename);
  ASTree::toDot(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void AST::toDot(std::string filename) {
    return ast->toDot(filename);
}